

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

bool parse_cpu_mask(string *mask,bool (*boolmask) [512])

{
  ulong uVar1;
  char cVar2;
  char cVar3;
  short sVar6;
  short sVar7;
  short sVar8;
  undefined8 uVar9;
  bool bVar10;
  ulong uVar11;
  char *pcVar12;
  common_log *log;
  bool *pbVar13;
  size_t i;
  ulong uVar14;
  byte bVar15;
  undefined1 uVar19;
  undefined1 auVar16 [16];
  short sVar21;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  char cVar4;
  char cVar5;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined2 uVar20;
  undefined4 uVar22;
  undefined6 uVar23;
  
  uVar11 = mask->_M_string_length;
  if (uVar11 < 2) {
    uVar14 = 0;
  }
  else {
    std::__cxx11::string::substr((ulong)&local_50,(ulong)mask);
    bVar10 = std::operator==(&local_50,"0x");
    std::__cxx11::string::~string((string *)&local_50);
    uVar14 = (ulong)((uint)bVar10 * 2);
    uVar11 = mask->_M_string_length;
  }
  uVar11 = uVar11 - uVar14;
  if (0x7f < uVar11) {
    uVar11 = 0x80;
  }
  uVar1 = uVar11 + uVar14;
  pbVar13 = *boolmask + (uVar11 & 0xffffffff) * 4;
  do {
    pbVar13 = pbVar13 + -4;
    if (uVar1 <= uVar14) {
LAB_001b824b:
      return uVar1 <= uVar14;
    }
    pcVar12 = (char *)std::__cxx11::string::at((ulong)mask);
    cVar2 = *pcVar12;
    bVar15 = cVar2 - 0x30;
    if (9 < bVar15) {
      if ((byte)(cVar2 + 0x9fU) < 6) {
        bVar15 = cVar2 + 0xa9;
      }
      else {
        if (5 < (byte)(cVar2 + 0xbfU)) {
          if (-1 < common_log_verbosity_thold) {
            log = common_log_main();
            common_log_add(log,GGML_LOG_LEVEL_ERROR,"Invalid hex character \'%c\' at position %d\n",
                           (ulong)(uint)(int)cVar2,uVar14 & 0xffffffff);
          }
          goto LAB_001b824b;
        }
        bVar15 = cVar2 - 0x37;
      }
    }
    uVar22 = *(undefined4 *)pbVar13;
    uVar19 = (undefined1)((uint)uVar22 >> 0x18);
    uVar20 = CONCAT11(uVar19,uVar19);
    uVar19 = (undefined1)((uint)uVar22 >> 0x10);
    uVar9 = CONCAT35(CONCAT21(uVar20,uVar19),CONCAT14(uVar19,uVar22));
    uVar19 = (undefined1)((uint)uVar22 >> 8);
    uVar23 = CONCAT51(CONCAT41((int)((ulong)uVar9 >> 0x20),uVar19),uVar19);
    auVar26._0_2_ = CONCAT11((char)uVar22,(char)uVar22);
    uVar11 = CONCAT62(uVar23,auVar26._0_2_);
    auVar18._8_4_ = 0;
    auVar18._0_8_ = uVar11;
    auVar18._12_2_ = uVar20;
    auVar18._14_2_ = uVar20;
    uVar20 = (undefined2)((ulong)uVar9 >> 0x20);
    auVar17._12_4_ = auVar18._12_4_;
    auVar17._8_2_ = 0;
    auVar17._0_8_ = uVar11;
    auVar17._10_2_ = uVar20;
    auVar16._10_6_ = auVar17._10_6_;
    auVar16._8_2_ = uVar20;
    auVar16._0_8_ = uVar11;
    uVar20 = (undefined2)uVar23;
    auVar26._8_8_ = auVar16._8_8_;
    auVar26._6_2_ = uVar20;
    auVar26._4_2_ = uVar20;
    auVar26._2_2_ = auVar26._0_2_;
    auVar24._1_3_ = 0;
    auVar24[0] = bVar15;
    auVar24[4] = bVar15;
    auVar24._5_3_ = 0;
    auVar24[8] = bVar15;
    auVar24._9_3_ = 0;
    auVar24[0xc] = bVar15;
    auVar24._13_3_ = 0;
    auVar24 = auVar24 & _DAT_001df480;
    auVar25._0_4_ = -(uint)(auVar24._0_4_ == (int)DAT_001df480);
    auVar25._4_4_ = -(uint)(auVar24._4_4_ == DAT_001df480._4_4_);
    auVar25._8_4_ = -(uint)(auVar24._8_4_ == DAT_001df480._8_4_);
    auVar25._12_4_ = -(uint)(auVar24._12_4_ == DAT_001df480._12_4_);
    auVar26 = (auVar25 | auVar26) & _DAT_001df490;
    sVar6 = auVar26._0_2_;
    cVar2 = (0 < sVar6) * (sVar6 < 0x100) * auVar26[0] - (0xff < sVar6);
    sVar6 = auVar26._2_2_;
    sVar21 = CONCAT11((0 < sVar6) * (sVar6 < 0x100) * auVar26[2] - (0xff < sVar6),cVar2);
    sVar6 = auVar26._4_2_;
    cVar3 = (0 < sVar6) * (sVar6 < 0x100) * auVar26[4] - (0xff < sVar6);
    sVar6 = auVar26._6_2_;
    uVar22 = CONCAT13((0 < sVar6) * (sVar6 < 0x100) * auVar26[6] - (0xff < sVar6),
                      CONCAT12(cVar3,sVar21));
    sVar6 = auVar26._8_2_;
    cVar4 = (0 < sVar6) * (sVar6 < 0x100) * auVar26[8] - (0xff < sVar6);
    sVar6 = auVar26._10_2_;
    uVar23 = CONCAT15((0 < sVar6) * (sVar6 < 0x100) * auVar26[10] - (0xff < sVar6),
                      CONCAT14(cVar4,uVar22));
    sVar6 = auVar26._12_2_;
    cVar5 = (0 < sVar6) * (sVar6 < 0x100) * auVar26[0xc] - (0xff < sVar6);
    sVar8 = auVar26._14_2_;
    sVar6 = (short)((uint)uVar22 >> 0x10);
    sVar7 = (short)((uint6)uVar23 >> 0x20);
    sVar8 = (short)(CONCAT17((0 < sVar8) * (sVar8 < 0x100) * auVar26[0xe] - (0xff < sVar8),
                             CONCAT16(cVar5,uVar23)) >> 0x30);
    *(uint *)pbVar13 =
         CONCAT13((0 < sVar8) * (sVar8 < 0x100) * cVar5 - (0xff < sVar8),
                  CONCAT12((0 < sVar7) * (sVar7 < 0x100) * cVar4 - (0xff < sVar7),
                           CONCAT11((0 < sVar6) * (sVar6 < 0x100) * cVar3 - (0xff < sVar6),
                                    (0 < sVar21) * (sVar21 < 0x100) * cVar2 - (0xff < sVar21))));
    uVar14 = uVar14 + 1;
  } while( true );
}

Assistant:

bool parse_cpu_mask(const std::string & mask, bool (&boolmask)[GGML_MAX_N_THREADS]) {
    // Discard potential 0x prefix
    size_t start_i = 0;
    if (mask.length() >= 2 && mask.substr(0, 2) == "0x") {
        start_i = 2;
    }

    size_t num_digits = mask.length() - start_i;
    if (num_digits > 128) num_digits = 128;

    size_t end_i = num_digits + start_i;

    for (size_t i = start_i, n = (num_digits*4 - 1); i < end_i; i++, n-=4) {
        char c = mask.at(i);
        int8_t id = c;

        if ((c >= '0' && c <= '9')) {
            id -= '0';
        } else if (c >= 'a' && c <= 'f') {
            id -= 'a' - 10;
        } else if (c >= 'A' && c <= 'F') {
            id -= 'A' - 10;
        } else {
            LOG_ERR("Invalid hex character '%c' at position %d\n", c, int32_t(i));
            return false;
        }

        boolmask[  n  ] = boolmask[  n  ] || ((id & 8) != 0);
        boolmask[n - 1] = boolmask[n - 1] || ((id & 4) != 0);
        boolmask[n - 2] = boolmask[n - 2] || ((id & 2) != 0);
        boolmask[n - 3] = boolmask[n - 3] || ((id & 1) != 0);
    }

    return true;
}